

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O0

void ExchCXX::mgga_screening_interface<ExchCXX::BuiltinM062X_C>::eval_exc_unpolar
               (double rho,double sigma,double lapl,double tau,double *eps)

{
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  double sigma_tol_sq;
  double *in_stack_00000600;
  double in_stack_00000608;
  double in_stack_00000610;
  double in_stack_00000618;
  double in_stack_00000620;
  double in_stack_ffffffffffffffc8;
  double x;
  
  if (1e-12 < in_XMM0_Qa) {
    x = 1.0000000000000042e-32;
    safe_max<double>(1.0000000000000042e-32,in_stack_ffffffffffffffc8);
    safe_max<double>(x,in_stack_ffffffffffffffc8);
    enforce_fermi_hole_curvature<double>(x,in_stack_ffffffffffffffc8,8.85431842144057e-318);
    kernel_traits<ExchCXX::BuiltinM062X_C>::eval_exc_unpolar_impl
              (in_stack_00000620,in_stack_00000618,in_stack_00000610,in_stack_00000608,
               in_stack_00000600);
  }
  else {
    *in_RDI = 0;
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar( double rho, double sigma, double lapl, double tau, double& eps ) {

    
    if( rho <= traits::dens_tol ) {
      eps = 0.;
    } else {
      constexpr auto sigma_tol_sq = traits::sigma_tol * traits::sigma_tol;
      sigma = safe_max(sigma, sigma_tol_sq); 
      tau   = safe_max(tau, traits::tau_tol);
      if constexpr (not traits::is_kedf) {
        sigma = enforce_fermi_hole_curvature(sigma, rho, tau);
      }

      traits::eval_exc_unpolar_impl(rho, sigma, lapl, tau, eps) ;
    }

  }